

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall
CCoinsViewErrorCatcher::GetCoin(CCoinsViewErrorCatcher *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *unaff_retaddr;
  undefined1 in_stack_00000050 [24];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ExecuteBackedWrapper<CCoinsViewErrorCatcher::GetCoin(COutPoint_const&,Coin&)const::__0>
                    ((anon_class_24_3_69851114)in_stack_00000050,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewErrorCatcher::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    return ExecuteBackedWrapper([&]() { return CCoinsViewBacked::GetCoin(outpoint, coin); }, m_err_callbacks);
}